

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O2

Abc_Cex_t * Pdr_ManDeriveCexAbs(Pdr_Man_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Pdr_Obl_t *pPVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Abc_Cex_t *pAVar8;
  Pdr_Set_t *pPVar9;
  Gia_Man_t *p_00;
  Abc_Cex_t *p_01;
  int iVar10;
  Pdr_Obl_t **ppPVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  Pdr_Obl_t **ppPVar16;
  int local_54;
  
  if ((p->pPars->fUseAbs != 0) && (pVVar12 = p->vMapPpi2Ff, pVVar12 != (Vec_Int_t *)0x0)) {
    iVar10 = p->pAig->nTruePis;
    for (iVar15 = 0; iVar15 < pVVar12->nSize; iVar15 = iVar15 + 1) {
      iVar4 = Vec_IntEntry(pVVar12,iVar15);
      iVar5 = Vec_IntEntry(p->vMapFf2Ppi,iVar4);
      if (iVar15 != iVar5) {
        __assert_fail("Vec_IntEntry( p->vMapFf2Ppi, Flop ) == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                      ,0x1cf,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
      }
      Vec_IntWriteEntry(p->vMapFf2Ppi,iVar4,-1);
      pVVar12 = p->vMapPpi2Ff;
    }
    pVVar12->nSize = 0;
    iVar15 = 0;
    ppPVar11 = &p->pQueue;
    ppPVar16 = ppPVar11;
    while (pPVar3 = *ppPVar16, pPVar3 != (Pdr_Obl_t *)0x0) {
      pPVar9 = pPVar3->pState;
      for (lVar13 = (long)pPVar9->nLits; lVar13 < pPVar9->nTotal; lVar13 = lVar13 + 1) {
        iVar4 = *(int *)(&pPVar9->field_0x14 + lVar13 * 4);
        iVar5 = Abc_Lit2Var(iVar4);
        if (iVar10 <= iVar5) {
          iVar4 = Abc_Lit2Var(iVar4);
          iVar4 = iVar4 - iVar10;
          iVar5 = Vec_IntEntry(p->vMapFf2Ppi,iVar4);
          if (iVar5 < 0) {
            Vec_IntWriteEntry(p->vMapFf2Ppi,iVar4,p->vMapPpi2Ff->nSize);
            Vec_IntPush(p->vMapPpi2Ff,iVar4);
          }
        }
        pPVar9 = pPVar3->pState;
      }
      iVar15 = iVar15 + 1;
      ppPVar16 = &pPVar3->pNext;
    }
    pVVar12 = p->vMapPpi2Ff;
    iVar4 = pVVar12->nSize;
    if (iVar4 != 0) {
      if (p->pPars->fUseSimpleRef == 0) {
        pAVar8 = Abc_CexAlloc(p->pAig->nRegs - iVar4,iVar4 + p->pAig->nTruePis,iVar15);
        pAVar8->iPo = p->iOutCur;
        pAVar8->iFrame = iVar15 + -1;
        local_54 = 0;
        while (pPVar3 = *ppPVar11, pPVar3 != (Pdr_Obl_t *)0x0) {
          pPVar9 = pPVar3->pState;
          for (lVar13 = (long)pPVar9->nLits; lVar13 < pPVar9->nTotal; lVar13 = lVar13 + 1) {
            iVar4 = *(int *)(&pPVar9->field_0x14 + lVar13 * 4);
            iVar5 = Abc_LitIsCompl(iVar4);
            if (iVar5 == 0) {
              iVar5 = Abc_Lit2Var(iVar4);
              if (iVar5 < iVar10) {
                iVar5 = pAVar8->nPis;
                iVar14 = pAVar8->nRegs;
                iVar4 = Abc_Lit2Var(iVar4);
                iVar4 = iVar4 + iVar5 * local_54 + iVar14;
              }
              else {
                pVVar12 = p->vMapFf2Ppi;
                iVar4 = Abc_Lit2Var(iVar4);
                iVar4 = Vec_IntEntry(pVVar12,iVar4 - iVar10);
                if (pAVar8->nPis <= iVar4 + iVar10) {
                  __assert_fail("iPPI < pCex->nPis",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                                ,0x200,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
                }
                iVar4 = pAVar8->nPis * local_54 + iVar4 + iVar10 + pAVar8->nRegs;
              }
              (&pAVar8[1].iPo)[iVar4 >> 5] =
                   (&pAVar8[1].iPo)[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
            }
            pPVar9 = pPVar3->pState;
          }
          local_54 = local_54 + 1;
          ppPVar11 = &pPVar3->pNext;
        }
        if (local_54 != iVar15) {
          __assert_fail("f == nFrames",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                        ,0x204,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
        }
        p_00 = Gia_ManDupAbs(p->pGia,p->vMapPpi2Ff,p->vMapFf2Ppi);
        iVar4 = 0;
        p_01 = Bmc_CexCareMinimizeAig(p_00,iVar10,pAVar8,1,0,0);
        Gia_ManStop(p_00);
        if (p_01->nPis != pAVar8->nPis) {
          __assert_fail("pCexCare->nPis == pCex->nPis",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                        ,0x209,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
        }
        Abc_CexFree(pAVar8);
        local_54 = 0;
        for (; iVar4 != iVar15; iVar4 = iVar4 + 1) {
          iVar14 = 0;
          for (iVar5 = iVar10; iVar5 < p_01->nPis; iVar5 = iVar5 + 1) {
            uVar6 = p_01->nPis * iVar4 + p_01->nRegs + iVar5;
            if (((uint)(&p_01[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
              pVVar12 = p->vAbsFlops;
              iVar7 = Vec_IntEntry(p->vMapPpi2Ff,iVar14);
              iVar7 = Vec_IntEntry(pVVar12,iVar7);
              if (iVar7 == 0) {
                pVVar12 = p->vAbsFlops;
                iVar7 = Vec_IntEntry(p->vMapPpi2Ff,iVar14);
                Vec_IntWriteEntry(pVVar12,iVar7,1);
                local_54 = local_54 + 1;
              }
            }
            iVar14 = iVar14 + 1;
          }
        }
        Abc_CexFree(p_01);
        if (local_54 == 0) goto LAB_004e2800;
      }
      else {
        for (iVar10 = 0; iVar10 < iVar4; iVar10 = iVar10 + 1) {
          iVar15 = Vec_IntEntry(pVVar12,iVar10);
          iVar4 = Vec_IntEntry(p->vAbsFlops,iVar15);
          if (iVar4 != 0) {
            __assert_fail("Vec_IntEntry(p->vAbsFlops, Flop) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                          ,0x1ea,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
          }
          Vec_IntWriteEntry(p->vAbsFlops,iVar15,1);
          pVVar12 = p->vMapPpi2Ff;
          iVar4 = pVVar12->nSize;
        }
      }
      uVar1 = p->nCexes;
      uVar2 = p->nCexesTotal;
      p->nCexes = uVar1 + 1;
      p->nCexesTotal = uVar2 + 1;
      return (Abc_Cex_t *)0x0;
    }
  }
LAB_004e2800:
  pAVar8 = Pdr_ManDeriveCex(p);
  return pAVar8;
}

Assistant:

Abc_Cex_t * Pdr_ManDeriveCexAbs( Pdr_Man_t * p )
{
    extern Gia_Man_t * Gia_ManDupAbs( Gia_Man_t * p, Vec_Int_t * vMapPpi2Ff, Vec_Int_t * vMapFf2Ppi );

    Gia_Man_t * pAbs;
    Abc_Cex_t * pCex, * pCexCare;
    Pdr_Obl_t * pObl;
    int i, f, Lit, Flop, nFrames = 0;
    int nPis = Saig_ManPiNum(p->pAig);
    int nFfRefined = 0;
    if ( !p->pPars->fUseAbs || !p->vMapPpi2Ff )
        return Pdr_ManDeriveCex(p);
    // restore previous map
    Vec_IntForEachEntry( p->vMapPpi2Ff, Flop, i )
    {
        assert( Vec_IntEntry( p->vMapFf2Ppi, Flop ) == i );
        Vec_IntWriteEntry( p->vMapFf2Ppi, Flop, -1 );
    }
    Vec_IntClear( p->vMapPpi2Ff );
    // count the number of frames
    for ( pObl = p->pQueue; pObl; pObl = pObl->pNext )
    {
        for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
        {
            Lit = pObl->pState->Lits[i]; 
            if ( Abc_Lit2Var(Lit) < nPis ) // PI literal
                continue;
            Flop = Abc_Lit2Var(Lit) - nPis;
            if ( Vec_IntEntry(p->vMapFf2Ppi, Flop) >= 0 ) // already used PPI literal
                continue;
            Vec_IntWriteEntry( p->vMapFf2Ppi, Flop, Vec_IntSize(p->vMapPpi2Ff) );
            Vec_IntPush( p->vMapPpi2Ff, Flop );
        }
        nFrames++;
    }
    if ( Vec_IntSize(p->vMapPpi2Ff) == 0 ) // no PPIs -- this is a real CEX
        return Pdr_ManDeriveCex(p);
    if ( p->pPars->fUseSimpleRef )
    {
        // rely on ternary simulation to perform refinement
        Vec_IntForEachEntry( p->vMapPpi2Ff, Flop, i )
        {
            assert( Vec_IntEntry(p->vAbsFlops, Flop) == 0 );
            Vec_IntWriteEntry( p->vAbsFlops, Flop, 1 );
            nFfRefined++;
        }
    }
    else
    {
        // create the counter-example
        pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig) - Vec_IntSize(p->vMapPpi2Ff), Saig_ManPiNum(p->pAig) + Vec_IntSize(p->vMapPpi2Ff), nFrames );
        pCex->iPo    = p->iOutCur;
        pCex->iFrame = nFrames-1;
        for ( pObl = p->pQueue, f = 0; pObl; pObl = pObl->pNext, f++ )
            for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
            {
                Lit = pObl->pState->Lits[i];
                if ( Abc_LitIsCompl(Lit) )
                    continue;
                if ( Abc_Lit2Var(Lit) < nPis ) // PI literal
                    Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Abc_Lit2Var(Lit) );
                else
                {
                    int iPPI = nPis + Vec_IntEntry(p->vMapFf2Ppi, Abc_Lit2Var(Lit) - nPis);
                    assert( iPPI < pCex->nPis );
                    Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + iPPI );
                }
            }
        assert( f == nFrames );
        // perform CEX minimization
        pAbs = Gia_ManDupAbs( p->pGia, p->vMapPpi2Ff, p->vMapFf2Ppi );
        pCexCare = Bmc_CexCareMinimizeAig( pAbs, nPis, pCex, 1, 0, 0 );
        Gia_ManStop( pAbs );
        assert( pCexCare->nPis == pCex->nPis );
        Abc_CexFree( pCex );
        // detect care PPIs
        for ( f = 0; f < nFrames; f++ )
        {
            for ( i = nPis; i < pCexCare->nPis; i++ )
                if ( Abc_InfoHasBit(pCexCare->pData, pCexCare->nRegs + pCexCare->nPis * f + i) )
                {
                    if ( Vec_IntEntry(p->vAbsFlops, Vec_IntEntry(p->vMapPpi2Ff, i-nPis)) == 0 ) // currently abstracted
                        Vec_IntWriteEntry( p->vAbsFlops, Vec_IntEntry(p->vMapPpi2Ff, i-nPis), 1 ), nFfRefined++;
                }
        }
        Abc_CexFree( pCexCare );
        if ( nFfRefined == 0 ) // no refinement -- this is a real CEX
            return Pdr_ManDeriveCex(p);
    }
    //printf( "CEX-based refinement refined %d flops.\n", nFfRefined );
    p->nCexesTotal++;
    p->nCexes++;
    return NULL;
}